

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsx-impl.inc.c
# Opt level: O0

void gen_mfvsrd(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  uint32_t uVar1;
  TCGv_i64 dst;
  TCGv_i64 t0;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  uVar1 = xS(ctx->opcode);
  if (uVar1 < 0x20) {
    if (((ctx->fpu_enabled ^ 0xffU) & 1) != 0) {
      gen_exception(ctx,7);
      return;
    }
  }
  else if (((ctx->altivec_enabled ^ 0xffU) & 1) != 0) {
    gen_exception(ctx,0x49);
    return;
  }
  dst = tcg_temp_new_i64(tcg_ctx_00);
  uVar1 = xS(ctx->opcode);
  get_cpu_vsrh(tcg_ctx_00,dst,uVar1);
  uVar1 = rA(ctx->opcode);
  tcg_gen_mov_i64_ppc64(tcg_ctx_00,cpu_gpr[uVar1],dst);
  tcg_temp_free_i64(tcg_ctx_00,dst);
  return;
}

Assistant:

static void gen_mfvsrd(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i64 t0;
    if (xS(ctx->opcode) < 32) {
        if (unlikely(!ctx->fpu_enabled)) {
            gen_exception(ctx, POWERPC_EXCP_FPU);
            return;
        }
    } else {
        if (unlikely(!ctx->altivec_enabled)) {
            gen_exception(ctx, POWERPC_EXCP_VPU);
            return;
        }
    }
    t0 = tcg_temp_new_i64(tcg_ctx);
    get_cpu_vsrh(tcg_ctx, t0, xS(ctx->opcode));
    tcg_gen_mov_i64(tcg_ctx, cpu_gpr[rA(ctx->opcode)], t0);
    tcg_temp_free_i64(tcg_ctx, t0);
}